

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

BOOL __thiscall
Js::InterpreterStackFrame::OP_BrOnHasEnvProperty
          (InterpreterStackFrame *this,Var envInstance,int32 slotIndex,uint propertyIdIndex,
          ScriptContext *scriptContext)

{
  long lVar1;
  Var instance;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  PropertyId propertyId;
  BOOL BVar4;
  undefined4 *puVar5;
  long lVar6;
  
  sourceContextId = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  lVar1 = *(long *)(this + 0x88);
  lVar6 = *(long *)(lVar1 + 0x10);
  if (lVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    lVar6 = *(long *)(lVar1 + 0x10);
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ClosureRangeCheckPhase,sourceContextId,
                            *(LocalFunctionId *)(lVar6 + 0x10));
  if ((!bVar3) && ((ulong)*(ushort *)((long)envInstance + 2) <= (long)slotIndex - 1U)) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  instance = *(Var *)((long)envInstance + (long)slotIndex * 8);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),propertyIdIndex);
  BVar4 = JavascriptOperators::OP_HasProperty(instance,propertyId,scriptContext);
  return BVar4;
}

Assistant:

BOOL InterpreterStackFrame::OP_BrOnHasEnvProperty(Var envInstance, int32 slotIndex, uint propertyIdIndex, ScriptContext* scriptContext)
    {
        Var instance = OP_LdFrameDisplaySlot(envInstance, slotIndex);
        return JavascriptOperators::OP_HasProperty(instance,
            this->m_functionBody->GetReferencedPropertyId(propertyIdIndex), scriptContext);
    }